

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STValidation.cpp
# Opt level: O2

PublicKey * __thiscall
jbcoin::STValidation::getSignerPublic(PublicKey *__return_storage_ptr__,STValidation *this)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  Slice local_20;
  
  STObject::getFieldVL((Blob *)&local_38,&this->super_STObject,(SField *)sfSigningPubKey);
  local_20.size_ =
       (long)local_38._M_impl.super__Vector_impl_data._M_finish -
       (long)local_38._M_impl.super__Vector_impl_data._M_start;
  local_20.data_ = local_38._M_impl.super__Vector_impl_data._M_start;
  PublicKey::PublicKey(__return_storage_ptr__,&local_20);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

PublicKey STValidation::getSignerPublic () const
{
    return PublicKey(makeSlice (getFieldVL (sfSigningPubKey)));
}